

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_decompose(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
                  utf8proc_ssize_t bufsize,utf8proc_option_t options)

{
  utf8proc_int32_t uc_00;
  utf8proc_int32_t uc_01;
  utf8proc_ssize_t uVar1;
  utf8proc_property_t *puVar2;
  utf8proc_property_t *puVar3;
  utf8proc_ssize_t local_98;
  utf8proc_property_t *property2;
  utf8proc_property_t *property1;
  utf8proc_int32_t uc2;
  utf8proc_int32_t uc1;
  utf8proc_ssize_t pos;
  utf8proc_ssize_t uStack_58;
  int boundclass;
  utf8proc_ssize_t decomp_result;
  utf8proc_ssize_t rpos;
  long lStack_40;
  utf8proc_int32_t uc;
  utf8proc_ssize_t wpos;
  utf8proc_ssize_t uStack_30;
  utf8proc_option_t options_local;
  utf8proc_ssize_t bufsize_local;
  utf8proc_int32_t *buffer_local;
  utf8proc_ssize_t strlen_local;
  utf8proc_uint8_t *str_local;
  
  lStack_40 = 0;
  if (((options & UTF8PROC_COMPOSE) == 0) || ((options & UTF8PROC_DECOMPOSE) == 0)) {
    if (((options & UTF8PROC_STRIPMARK) == 0) ||
       (((options & UTF8PROC_COMPOSE) != 0 || ((options & UTF8PROC_DECOMPOSE) != 0)))) {
      decomp_result = 0;
      pos._4_4_ = 0;
      wpos._4_4_ = options;
      uStack_30 = bufsize;
      bufsize_local = (utf8proc_ssize_t)buffer;
      buffer_local = (utf8proc_int32_t *)strlen;
      strlen_local = (utf8proc_ssize_t)str;
      do {
        if ((wpos._4_4_ & UTF8PROC_NULLTERM) == 0) {
          if ((long)buffer_local <= decomp_result) goto LAB_0018fcf9;
          uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(strlen_local + decomp_result),
                                   (long)buffer_local - decomp_result,
                                   (utf8proc_int32_t *)((long)&rpos + 4));
          decomp_result = uVar1 + decomp_result;
          if (rpos._4_4_ < 0) {
            return -3;
          }
        }
        else {
          uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(strlen_local + decomp_result),-1,
                                   (utf8proc_int32_t *)((long)&rpos + 4));
          decomp_result = uVar1 + decomp_result;
          if (rpos._4_4_ < 0) {
            return -3;
          }
          if (decomp_result < 0) {
            return -2;
          }
          if (rpos._4_4_ == 0) {
LAB_0018fcf9:
            if (((wpos._4_4_ & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0) &&
               (lStack_40 <= uStack_30)) {
              _uc2 = 0;
              while (_uc2 < lStack_40 + -1) {
                uc_00 = *(utf8proc_int32_t *)(bufsize_local + _uc2 * 4);
                uc_01 = *(utf8proc_int32_t *)(bufsize_local + 4 + _uc2 * 4);
                puVar2 = unsafe_get_property(uc_00);
                puVar3 = unsafe_get_property(uc_01);
                if ((puVar3->combining_class < puVar2->combining_class) &&
                   (0 < puVar3->combining_class)) {
                  *(utf8proc_int32_t *)(bufsize_local + _uc2 * 4) = uc_01;
                  *(utf8proc_int32_t *)(bufsize_local + 4 + _uc2 * 4) = uc_00;
                  if (_uc2 < 1) {
                    _uc2 = _uc2 + 1;
                  }
                  else {
                    _uc2 = _uc2 + -1;
                  }
                }
                else {
                  _uc2 = _uc2 + 1;
                }
              }
            }
            return lStack_40;
          }
        }
        if (lStack_40 < uStack_30) {
          local_98 = uStack_30 - lStack_40;
        }
        else {
          local_98 = 0;
        }
        uStack_58 = utf8proc_decompose_char
                              (rpos._4_4_,(utf8proc_int32_t *)(bufsize_local + lStack_40 * 4),
                               local_98,wpos._4_4_,(int *)((long)&pos + 4));
        if (uStack_58 < 0) {
          return uStack_58;
        }
        lStack_40 = uStack_58 + lStack_40;
      } while ((-1 < lStack_40) && (lStack_40 < 0x1000000000000000));
      str_local = (utf8proc_uint8_t *)0xfffffffffffffffe;
    }
    else {
      str_local = (utf8proc_uint8_t *)0xfffffffffffffffb;
    }
  }
  else {
    str_local = (utf8proc_uint8_t *)0xfffffffffffffffb;
  }
  return (utf8proc_ssize_t)str_local;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer + wpos, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
      } else {
        pos++;
      }
    }
  }
  return wpos;
}